

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void rw::flipDXT(int32 type,uint8 *dst,uint8 *src,uint32 width,uint32 height)

{
  if (type == 5) {
    flipDXT5(dst,src,width,height);
    return;
  }
  if (type != 3) {
    if (type == 1) {
      flipDXT1(dst,src,width,height);
      return;
    }
    return;
  }
  flipDXT3(dst,src,width,height);
  return;
}

Assistant:

void
flipDXT(int32 type, uint8 *dst, uint8 *src, uint32 width, uint32 height)
{
	switch(type){
	case 1:
		flipDXT1(dst, src, width, height);
		break;
	case 3:
		flipDXT3(dst, src, width, height);
		break;
	case 5:
		flipDXT5(dst, src, width, height);
		break;
	}
}